

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,char *significand,
          int significand_size,int integral_size,wchar_t decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_00;
  wchar_t local_2c;
  
  local_2c = decimal_point;
  out_00 = copy_str_noinline<wchar_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                     (significand,significand + integral_size,out);
  if (decimal_point != L'\0') {
    buffer<wchar_t>::push_back(out_00.container,&local_2c);
    out_00 = copy_str_noinline<wchar_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                       (significand + integral_size,significand + significand_size,out_00);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_00.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}